

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall google::protobuf::io::CordInputStream::BackUp(CordInputStream *this,int count)

{
  LogMessage *pLVar1;
  undefined1 auVar2 [16];
  LogMessageFatal local_48 [23];
  Voidify local_31;
  unsigned_long local_30;
  unsigned_long local_28;
  string *local_20;
  string *absl_log_internal_check_op_result;
  CordInputStream *pCStack_10;
  int count_local;
  CordInputStream *this_local;
  
  absl_log_internal_check_op_result._4_4_ = count;
  pCStack_10 = this;
  local_28 = absl::lts_20240722::log_internal::GetReferenceableValue((long)count);
  local_30 = absl::lts_20240722::log_internal::GetReferenceableValue(this->size_ - this->available_)
  ;
  local_20 = absl::lts_20240722::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                       (&local_28,&local_30,"static_cast<size_t>(count) <= size_ - available_");
  if (local_20 != (string *)0x0) {
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x201,auVar2._0_8_,auVar2._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_48);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_31,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_48);
  }
  this->available_ = (long)absl_log_internal_check_op_result._4_4_ + this->available_;
  this->bytes_remaining_ = (long)absl_log_internal_check_op_result._4_4_ + this->bytes_remaining_;
  return;
}

Assistant:

void CordInputStream::BackUp(int count) {
  // Backup is only allowed on last returned chunk from `Next()`.
  ABSL_CHECK_LE(static_cast<size_t>(count), size_ - available_);

  available_ += count;
  bytes_remaining_ += count;
}